

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O3

u32 __thiscall
irr::scene::COBJMeshFileLoader::copyWord
          (COBJMeshFileLoader *this,c8 *outBuf,c8 *inBuf,u32 outBufLength,c8 *bufEnd)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = 0;
  if (outBufLength != 0) {
    if (inBuf != (c8 *)0x0) {
      while( true ) {
        uVar5 = (ulong)uVar1;
        if ((((ulong)(byte)inBuf[uVar5] < 0x21) &&
            ((0x100003e01U >> ((ulong)(byte)inBuf[uVar5] & 0x3f) & 1) != 0)) ||
           (inBuf + uVar5 == bufEnd)) break;
        uVar1 = uVar1 + 1;
      }
      uVar2 = outBufLength - 1;
      if (uVar2 <= uVar1) {
        uVar1 = uVar2;
      }
      if (uVar1 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)uVar1;
        uVar3 = (ulong)uVar2;
        if (uVar5 < uVar2) {
          uVar3 = uVar5;
        }
        uVar5 = 0;
        do {
          outBuf[uVar5] = inBuf[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      outBuf = outBuf + uVar4;
    }
    *outBuf = '\0';
  }
  return uVar1;
}

Assistant:

u32 COBJMeshFileLoader::copyWord(c8 *outBuf, const c8 *const inBuf, u32 outBufLength, const c8 *const bufEnd)
{
	if (!outBufLength)
		return 0;
	if (!inBuf) {
		*outBuf = 0;
		return 0;
	}

	u32 i = 0;
	while (inBuf[i]) {
		if (core::isspace(inBuf[i]) || &(inBuf[i]) == bufEnd)
			break;
		++i;
	}

	u32 length = core::min_(i, outBufLength - 1);
	for (u32 j = 0; j < length; ++j)
		outBuf[j] = inBuf[j];

	outBuf[length] = 0;
	return length;
}